

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O3

int Gia_ObjComputeEdgeDelay2
              (Gia_Man_t *p,int iObj,Vec_Int_t *vDelay,Vec_Int_t *vEdge1,Vec_Int_t *vEdge2,
              Vec_Int_t *vFanMax1,Vec_Int_t *vFanMax2,Vec_Int_t *vCountMax)

{
  uint uVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  Vec_Int_t *pVVar6;
  Vec_Wec_t *pVVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int *piVar12;
  uint *puVar13;
  long lVar14;
  uint *puVar15;
  uint *puVar16;
  long lVar17;
  
  if ((iObj < 0) || (vEdge1->nSize <= iObj)) goto LAB_001f9fd9;
  piVar12 = vEdge1->pArray;
  piVar12[(uint)iObj] = 0;
  if (vEdge2->nSize <= iObj) goto LAB_001f9fd9;
  piVar2 = vEdge2->pArray;
  piVar2[(uint)iObj] = 0;
  if ((vDelay->nSize <= iObj) || (vCountMax->nSize <= iObj)) goto LAB_001f9edb;
  piVar3 = vDelay->pArray;
  iVar8 = piVar3[(uint)iObj];
  piVar4 = vCountMax->pArray;
  if (iVar8 == 0) {
    iVar8 = 0;
  }
  else {
    puVar16 = (uint *)(piVar12 + (uint)iObj);
    puVar15 = (uint *)(piVar2 + (uint)iObj);
    if (piVar4[(uint)iObj] == 2) {
      if ((vFanMax1->nSize <= iObj) || (vFanMax2->nSize <= iObj)) goto LAB_001f9edb;
      uVar9 = vFanMax1->pArray[(uint)iObj];
      if (((int)uVar9 < 0) ||
         ((uVar11 = vEdge1->nSize, (int)uVar11 <= (int)uVar9 || (vEdge2->nSize <= (int)uVar9))))
      goto LAB_001f9edb;
      uVar1 = vFanMax2->pArray[(uint)iObj];
      if (((int)uVar1 < 0) || ((uVar11 <= uVar1 || ((uint)vEdge2->nSize <= uVar1))))
      goto LAB_001f9edb;
      if ((0 < piVar12[uVar9] && 0 < piVar2[uVar9]) || (0 < piVar12[uVar1] && 0 < piVar2[uVar1]))
      goto LAB_001f9de4;
      piVar5 = piVar12;
      if ((piVar12[uVar9] == 0) || (piVar5 = piVar2, piVar2[uVar9] == 0)) {
        piVar5[uVar9] = iObj;
        uVar11 = vEdge1->nSize;
      }
      if ((int)uVar11 <= (int)uVar1) goto LAB_001f9edb;
      piVar12 = piVar12 + uVar1;
      if (*piVar12 == 0) {
LAB_001f9d74:
        *piVar12 = iObj;
        uVar11 = vEdge1->nSize;
      }
      else {
        if (vEdge2->nSize <= (int)uVar1) goto LAB_001f9edb;
        piVar12 = piVar2 + uVar1;
        if (*piVar12 == 0) goto LAB_001f9d74;
      }
      if ((int)uVar11 <= iObj) goto LAB_001f9edb;
      puVar13 = puVar16;
      if (*puVar16 == 0) {
LAB_001f9dab:
        *puVar13 = uVar9;
        uVar11 = vEdge1->nSize;
      }
      else {
        if (vEdge2->nSize <= iObj) goto LAB_001f9edb;
        puVar13 = puVar15;
        if (*puVar15 == 0) goto LAB_001f9dab;
      }
      if ((int)uVar11 <= iObj) goto LAB_001f9edb;
      if (*puVar16 != 0) {
        if (vEdge2->nSize <= iObj) goto LAB_001f9edb;
        puVar16 = puVar15;
        if (*puVar15 != 0) goto LAB_001f9de2;
      }
      *puVar16 = uVar1;
    }
    else {
      if (piVar4[(uint)iObj] != 1) goto LAB_001f9de4;
      if (vFanMax1->nSize <= iObj) goto LAB_001f9edb;
      uVar9 = vFanMax1->pArray[(uint)iObj];
      lVar14 = (long)(int)uVar9;
      if (((lVar14 < 0) || (iVar10 = vEdge1->nSize, iVar10 <= (int)uVar9)) ||
         (vEdge2->nSize <= (int)uVar9)) goto LAB_001f9edb;
      if (0 < piVar12[lVar14] && 0 < piVar2[lVar14]) goto LAB_001f9de4;
      if ((piVar12[lVar14] == 0) || (piVar12 = piVar2, piVar2[lVar14] == 0)) {
        piVar12[lVar14] = iObj;
        iVar10 = vEdge1->nSize;
      }
      if (iVar10 <= iObj) goto LAB_001f9edb;
      if (*puVar16 == 0) {
LAB_001f9d1c:
        *puVar16 = uVar9;
      }
      else {
        if (vEdge2->nSize <= iObj) goto LAB_001f9edb;
        puVar16 = puVar15;
        if (*puVar15 == 0) goto LAB_001f9d1c;
      }
    }
LAB_001f9de2:
    iVar8 = iVar8 + -1;
  }
LAB_001f9de4:
  if (vDelay->nSize <= iObj) {
LAB_001f9fd9:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  piVar3[(uint)iObj] = iVar8;
  pVVar6 = p->vMapping;
  if (pVVar6 == (Vec_Int_t *)0x0) {
LAB_001f9efa:
    pVVar7 = p->vMapping2;
    if (iObj < pVVar7->nSize) {
      pVVar6 = pVVar7->pArray;
      if (pVVar6[(uint)iObj].nSize == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                      ,0x235,
                      "int Gia_ObjComputeEdgeDelay2(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      lVar14 = 0;
      do {
        if (pVVar6[(uint)iObj].nSize <= lVar14) {
          return iVar8;
        }
        iVar10 = pVVar6[(uint)iObj].pArray[lVar14];
        lVar17 = (long)iVar10;
        if ((lVar17 < 0) || (vDelay->nSize <= iVar10)) goto LAB_001f9edb;
        if (iVar8 < piVar3[lVar17]) {
          if (piVar3[lVar17] == iVar8 + 1) {
            if (vFanMax2->nSize <= iVar10) goto LAB_001f9fd9;
            vFanMax2->pArray[lVar17] = iObj;
            if (vCountMax->nSize <= iVar10) {
LAB_001f9ff8:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
            }
            piVar4[lVar17] = piVar4[lVar17] + 1;
          }
        }
        else {
          piVar3[lVar17] = iVar8 + 1;
          if ((vFanMax1->nSize <= iVar10) ||
             (vFanMax1->pArray[lVar17] = iObj, vCountMax->nSize <= iVar10)) goto LAB_001f9fd9;
          piVar4[lVar17] = 1;
        }
        lVar14 = lVar14 + 1;
      } while (iObj < pVVar7->nSize);
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  uVar9 = pVVar6->nSize;
  if (iObj < (int)uVar9) {
    piVar12 = pVVar6->pArray;
    if (piVar12[(uint)iObj] == 0) goto LAB_001f9efa;
    lVar14 = 0;
    while( true ) {
      lVar17 = (long)piVar12[(uint)iObj];
      if ((lVar17 < 0) || (uVar9 <= (uint)piVar12[(uint)iObj])) break;
      if (piVar12[lVar17] <= lVar14) {
        return iVar8;
      }
      iVar10 = piVar12[lVar17 + lVar14 + 1];
      lVar17 = (long)iVar10;
      if ((lVar17 < 0) || (vDelay->nSize <= iVar10)) break;
      if (iVar8 < piVar3[lVar17]) {
        if (piVar3[lVar17] == iVar8 + 1) {
          if (vFanMax2->nSize <= iVar10) goto LAB_001f9fd9;
          vFanMax2->pArray[lVar17] = iObj;
          if (vCountMax->nSize <= iVar10) goto LAB_001f9ff8;
          piVar4[lVar17] = piVar4[lVar17] + 1;
        }
      }
      else {
        piVar3[lVar17] = iVar8 + 1;
        if ((vFanMax1->nSize <= iVar10) ||
           (vFanMax1->pArray[lVar17] = iObj, vCountMax->nSize <= iVar10)) goto LAB_001f9fd9;
        piVar4[lVar17] = 1;
      }
      lVar14 = lVar14 + 1;
      uVar9 = pVVar6->nSize;
      if ((int)uVar9 <= iObj) break;
    }
  }
LAB_001f9edb:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Gia_ObjComputeEdgeDelay2( Gia_Man_t * p, int iObj, Vec_Int_t * vDelay, Vec_Int_t * vEdge1, Vec_Int_t * vEdge2, Vec_Int_t * vFanMax1, Vec_Int_t * vFanMax2, Vec_Int_t * vCountMax )
{
    int i, iFan, DelayFanin, Status1, Status2;
    int DelayMax = 0, nCountMax = 0;
    int iFanMax1 = -1, iFanMax2 = -1;
    Vec_IntWriteEntry(vEdge1, iObj, 0);
    Vec_IntWriteEntry(vEdge2, iObj, 0);
    // analyze this node
    DelayMax = Vec_IntEntry( vDelay, iObj );
    nCountMax = Vec_IntEntry( vCountMax, iObj );
    if ( DelayMax == 0 )
    {}
    else if ( nCountMax == 1 )
    {
        iFanMax1 = Vec_IntEntry( vFanMax1, iObj );
        Status1 = Gia_ObjEdgeCount( iFanMax1, vEdge1, vEdge2 );
        if ( Status1 <= 1 )
        {
            Gia_ObjEdgeAdd( iFanMax1, iObj, vEdge1, vEdge2 );
            Gia_ObjEdgeAdd( iObj, iFanMax1, vEdge1, vEdge2 );
            DelayMax--;
        }
    }
    else if ( nCountMax == 2 )
    {
        iFanMax1 = Vec_IntEntry( vFanMax1, iObj );
        iFanMax2 = Vec_IntEntry( vFanMax2, iObj );
        Status1 = Gia_ObjEdgeCount( iFanMax1, vEdge1, vEdge2 );
        Status2 = Gia_ObjEdgeCount( iFanMax2, vEdge1, vEdge2 );
        if ( Status1 <= 1 && Status2 <= 1 )
        {
            Gia_ObjEdgeAdd( iFanMax1, iObj, vEdge1, vEdge2 );
            Gia_ObjEdgeAdd( iFanMax2, iObj, vEdge1, vEdge2 );
            Gia_ObjEdgeAdd( iObj, iFanMax1, vEdge1, vEdge2 );
            Gia_ObjEdgeAdd( iObj, iFanMax2, vEdge1, vEdge2 );
            DelayMax--;
        }
    }
    Vec_IntWriteEntry( vDelay, iObj, DelayMax );
    // computed DelayMax at this point
    if ( Gia_ManHasMapping(p) && Gia_ObjIsLut(p, iObj) )
    {
        Gia_LutForEachFanin( p, iObj, iFan, i )
        {
            DelayFanin = Vec_IntEntry( vDelay, iFan );
            if ( DelayFanin < DelayMax + 1 )
            {
                Vec_IntWriteEntry( vDelay, iFan, DelayMax + 1 );
                Vec_IntWriteEntry( vFanMax1, iFan, iObj );
                Vec_IntWriteEntry( vCountMax, iFan, 1 );
            }
            else if ( DelayFanin == DelayMax + 1 )
            {
                Vec_IntWriteEntry( vFanMax2, iFan, iObj );
                Vec_IntAddToEntry( vCountMax, iFan, 1 );
            }
        }
    }
    else if ( Gia_ObjIsLut2(p, iObj) )
    {
        Gia_LutForEachFanin2( p, iObj, iFan, i )
        {
            DelayFanin = Vec_IntEntry( vDelay, iFan );
            if ( DelayFanin < DelayMax + 1 )
            {
                Vec_IntWriteEntry( vDelay, iFan, DelayMax + 1 );
                Vec_IntWriteEntry( vFanMax1, iFan, iObj );
                Vec_IntWriteEntry( vCountMax, iFan, 1 );
            }
            else if ( DelayFanin == DelayMax + 1 )
            {
                Vec_IntWriteEntry( vFanMax2, iFan, iObj );
                Vec_IntAddToEntry( vCountMax, iFan, 1 );
            }
        }
    }
    else assert( 0 );
    return DelayMax;
}